

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::FuncCaseBase::FuncCaseBase
          (FuncCaseBase *this,CaseContext *context,string *name,FuncBase *func)

{
  string local_40;
  
  (*func->_vptr_FuncBase[3])(&local_40,func);
  PrecisionCase::PrecisionCase(&this->super_PrecisionCase,context,name,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_PrecisionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FuncCaseBase_00d34e48;
  (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr = (Statement *)0x0;
  (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state =
       (SharedPtrStateBase *)0x0;
  return;
}

Assistant:

FuncCaseBase	(const CaseContext& context, const string& name, const FuncBase& func)
									: PrecisionCase	(context, name, func.getRequiredExtension())
								{
								}